

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::anon_unknown_6::OutSliceInfo::OutSliceInfo
          (OutSliceInfo *this,PixelType t,char *b,size_t xs,size_t ys,int xsm,int ysm,bool z)

{
  bool z_local;
  int xsm_local;
  size_t ys_local;
  size_t xs_local;
  char *b_local;
  PixelType t_local;
  OutSliceInfo *this_local;
  
  this->type = t;
  this->base = b;
  this->xStride = xs;
  this->yStride = ys;
  this->xSampling = xsm;
  this->ySampling = ysm;
  this->zero = z;
  return;
}

Assistant:

OutSliceInfo::OutSliceInfo (PixelType t,
		            const char *b,
		            size_t xs, size_t ys,
		            int xsm, int ysm,
		            bool z)
:
    type (t),
    base (b),
    xStride (xs),
    yStride (ys),
    xSampling (xsm),
    ySampling (ysm),
    zero (z)
{
    // empty
}